

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexSeparableKernel::splitL(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  Res RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  
  iVar2 = this->u;
  iVar8 = this->uw;
  RVar1 = this->res;
  if (-iVar2 < iVar8) {
    iVar8 = this->v;
    iVar3 = this->vw;
    pfVar6 = this->ku;
    pfVar7 = this->kv;
    k->res = RVar1;
    k->u = (1 << (RVar1.ulog2 & 0x1fU)) + iVar2;
    k->v = iVar8;
    k->uw = -iVar2;
    k->vw = iVar3;
    memcpy(k->kubuff,pfVar6,(long)iVar2 * -4);
    memcpy(k->kvbuff,pfVar7,(long)iVar3 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = 0;
    iVar8 = this->uw + iVar2;
    this->ku = this->ku + -(long)iVar2;
  }
  else {
    iVar3 = this->v;
    iVar4 = this->vw;
    pfVar6 = this->ku;
    pfVar7 = this->kv;
    iVar5 = this->rot;
    k->res = RVar1;
    k->u = iVar2;
    k->v = iVar3;
    k->uw = iVar8;
    k->vw = iVar4;
    memcpy(k->kubuff,pfVar6,(long)iVar8 << 2);
    memcpy(k->kvbuff,pfVar7,(long)iVar4 << 2);
    k->ku = k->kubuff;
    k->kv = k->kvbuff;
    k->rot = iVar5;
    k->u = (1 << ((this->res).ulog2 & 0x1fU)) + iVar2;
    iVar8 = 0;
  }
  this->u = 0;
  this->uw = iVar8;
  return;
}

Assistant:

void splitL(PtexSeparableKernel& k)
    {
        // split off left piece of width w into k
        int w = -u;

        if (w < uw) {
            // normal case - split off a portion
            //    res  u          v  uw vw  ku  kv
            k.set(res, res.u()-w, v, w, vw, ku, kv);

            // update local
            u = 0;
            uw -= w;
            ku += w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u += res.u();
            u = 0; uw = 0;
        }
    }